

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcClp.c
# Opt level: O3

int Bmc_CollapseExpand2(sat_solver *pSat,sat_solver *pSatOn,Vec_Int_t *vLits,Vec_Int_t *vNums,
                       Vec_Int_t *vTemp,int nBTLimit,int fCanon,int fOnOffSetLit)

{
  uint uVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  long nConfLimit;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  long lVar9;
  
  if (fCanon == 0) {
    if (-1 < fOnOffSetLit) {
      Vec_IntPush(vLits,fOnOffSetLit);
    }
    nConfLimit = (long)nBTLimit;
    iVar4 = sat_solver_solve(pSat,vLits->pArray,vLits->pArray + vLits->nSize,nConfLimit,0,0,0);
    if (-1 < fOnOffSetLit) {
      if (vLits->nSize < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x3b1,"int Vec_IntPop(Vec_Int_t *)");
      }
      vLits->nSize = vLits->nSize + -1;
    }
    if (iVar4 != -1) {
      if (iVar4 == 0) {
        return -1;
      }
      __assert_fail("status == l_False",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcClp.c"
                    ,0x1f2,
                    "int Bmc_CollapseExpand2(sat_solver *, sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, int, int)"
                   );
    }
    uVar8 = (pSat->conf_final).size;
    piVar2 = (pSat->conf_final).ptr;
    vNums->nSize = 0;
    vTemp->nSize = 0;
    if (-1 < fOnOffSetLit) {
      Vec_IntPush(vTemp,fOnOffSetLit);
    }
    iVar4 = vLits->nSize;
    if (0 < iVar4) {
      lVar9 = 0;
      do {
        uVar5 = vLits->pArray[lVar9];
        uVar6 = 0;
        if ((int)uVar8 < 1) {
LAB_005300f3:
          if ((uint)uVar6 != uVar8) {
            Vec_IntPush(vNums,(int)lVar9);
            Vec_IntPush(vTemp,uVar5);
            iVar4 = vLits->nSize;
          }
        }
        else {
          uVar6 = 0;
          do {
            uVar1 = piVar2[uVar6];
            if ((int)uVar1 < 0) goto LAB_0053033a;
            if ((uVar1 ^ uVar5) == 1) goto LAB_005300f3;
            uVar6 = uVar6 + 1;
          } while (uVar8 != uVar6);
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar4);
    }
    iVar4 = sat_solver_solve(pSat,vTemp->pArray,vTemp->pArray + vTemp->nSize,nConfLimit,0,0,0);
    if (iVar4 != -1) {
      if (iVar4 == 0) {
        return -1;
      }
      __assert_fail("status == l_False",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcClp.c"
                    ,0x20c,
                    "int Bmc_CollapseExpand2(sat_solver *, sat_solver *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, int, int, int)"
                   );
    }
    iVar4 = vTemp->nSize;
    if (iVar4 < 1) {
      if (vNums->nSize < 0) goto LAB_005303f4;
      vNums->nSize = 0;
    }
    else {
      uVar8 = (pSat->conf_final).size;
      piVar2 = (pSat->conf_final).ptr;
      piVar3 = vTemp->pArray;
      lVar9 = 0;
      uVar5 = 0;
      do {
        if (piVar3[lVar9] != fOnOffSetLit) {
          uVar6 = 0;
          if ((int)uVar8 < 1) {
LAB_005301c7:
            if ((uint)uVar6 != uVar8) {
              if (vNums->nSize <= lVar9) {
LAB_00530359:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                              ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              if (((int)uVar5 < 0) || (vNums->nSize <= (int)uVar5)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                              ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
              }
              uVar6 = (ulong)uVar5;
              uVar5 = uVar5 + 1;
              vNums->pArray[uVar6] = vNums->pArray[lVar9];
              iVar4 = vTemp->nSize;
            }
          }
          else {
            do {
              uVar1 = piVar2[uVar6];
              if ((int)uVar1 < 0) {
LAB_0053033a:
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                              ,0xf4,"int Abc_LitNot(int)");
              }
              if ((uVar1 ^ piVar3[lVar9]) == 1) goto LAB_005301c7;
              uVar6 = uVar6 + 1;
            } while (uVar8 != uVar6);
          }
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar4);
      if (vNums->nSize < (int)uVar5) {
LAB_005303f4:
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x2ac,"void Vec_IntShrink(Vec_Int_t *, int)");
      }
      vNums->nSize = uVar5;
      if (0 < (int)uVar5) {
        uVar6 = 0;
        do {
          vTemp->nSize = 0;
          if (-1 < fOnOffSetLit) {
            Vec_IntPush(vTemp,fOnOffSetLit);
          }
          iVar4 = vNums->nSize;
          if (0 < iVar4) {
            uVar7 = 0;
            do {
              if (uVar6 != uVar7) {
                uVar8 = vNums->pArray[uVar7];
                if (((int)uVar8 < 0) || (vLits->nSize <= (int)uVar8)) goto LAB_00530359;
                Vec_IntPush(vTemp,vLits->pArray[uVar8]);
                iVar4 = vNums->nSize;
              }
              uVar7 = uVar7 + 1;
            } while ((long)uVar7 < (long)iVar4);
          }
          iVar4 = sat_solver_solve(pSat,vTemp->pArray,vTemp->pArray + vTemp->nSize,nConfLimit,0,0,0)
          ;
          uVar8 = (uint)uVar6;
          if (iVar4 == 1) {
            uVar5 = vNums->nSize;
            uVar6 = (ulong)(uVar8 + 1);
          }
          else {
            if (iVar4 == 0) {
              return -1;
            }
            if (((int)uVar8 < 0) || (vNums->nSize <= (int)uVar8)) {
              __assert_fail("i >= 0 && i < Vec_IntSize(p)",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x3ff,"void Vec_IntDrop(Vec_Int_t *, int)");
            }
            uVar5 = vNums->nSize - 1;
            vNums->nSize = uVar5;
            if (uVar8 < uVar5) {
              piVar2 = vNums->pArray;
              lVar9 = 0;
              do {
                piVar2[uVar6 + lVar9] = piVar2[uVar6 + lVar9 + 1];
                uVar5 = vNums->nSize;
                lVar9 = lVar9 + 1;
              } while ((int)((int)lVar9 + uVar8) < (int)uVar5);
            }
          }
        } while ((int)uVar6 < (int)uVar5);
      }
    }
  }
  else {
    iVar4 = Bmc_CollapseExpandRound(pSat,pSatOn,vLits,vNums,vTemp,nBTLimit,fCanon,-1);
    if (iVar4 == -1) {
      return -1;
    }
    iVar4 = Bmc_CollapseExpandRound(pSat,(sat_solver *)0x0,vLits,vNums,vTemp,nBTLimit,fCanon,-1);
    if (iVar4 == -1) {
      return -1;
    }
  }
  return 0;
}

Assistant:

int Bmc_CollapseExpand2( sat_solver * pSat, sat_solver * pSatOn, Vec_Int_t * vLits, Vec_Int_t * vNums, Vec_Int_t * vTemp, int nBTLimit, int fCanon, int fOnOffSetLit )
{
    // perform one quick reduction if it is non-canonical
    if ( !fCanon )
    {
        int i, k, iLit, j, iNum, status, nFinal, * pFinal;

        // check against offset
        if ( fOnOffSetLit >= 0 )
            Vec_IntPush( vLits, fOnOffSetLit );
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), nBTLimit, 0, 0, 0 );
        if ( fOnOffSetLit >= 0 )
            Vec_IntPop( vLits );
        if ( status == l_Undef )
            return -1;
        assert( status == l_False );

        // get subset of literals
        nFinal = sat_solver_final( pSat, &pFinal );
        Vec_IntClear( vNums );
        Vec_IntClear( vTemp );
        if ( fOnOffSetLit >= 0 )
        {
            //Vec_IntPush( vNums, -1 );
            Vec_IntPush( vTemp, fOnOffSetLit );
        }
        Vec_IntForEachEntry( vLits, iLit, i )
        {
            for ( k = 0; k < nFinal; k++ )
                if ( iLit == Abc_LitNot(pFinal[k]) )
                    break;
            if ( k == nFinal )
                continue;
            Vec_IntPush( vNums, i );
            Vec_IntPush( vTemp, iLit );
        }

        // check against offset
        status = sat_solver_solve( pSat, Vec_IntArray(vTemp), Vec_IntLimit(vTemp), nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            return -1;
        assert( status == l_False );

        // get subset of literals
        nFinal = sat_solver_final( pSat, &pFinal );
        j = 0;
        Vec_IntForEachEntry( vTemp, iLit, i )
        {
            if ( iLit == fOnOffSetLit )
                continue;
            for ( k = 0; k < nFinal; k++ )
                if ( iLit == Abc_LitNot(pFinal[k]) )
                    break;
            if ( k == nFinal )
                continue;
            Vec_IntWriteEntry( vNums, j++, Vec_IntEntry(vNums, i) );
        }
        Vec_IntShrink( vNums, j );


        // try removing each literal
        for ( i = 0; i < Vec_IntSize(vNums); i++ )
        {
            Vec_IntClear( vTemp );
            if ( fOnOffSetLit >= 0 )
                Vec_IntPush( vTemp, fOnOffSetLit );
            Vec_IntForEachEntry( vNums, iNum, k )
                if ( k != i )
                    Vec_IntPush( vTemp, Vec_IntEntry(vLits, iNum) );
            // check against offset
            status = sat_solver_solve( pSat, Vec_IntArray(vTemp), Vec_IntLimit(vTemp), nBTLimit, 0, 0, 0 );
            if ( status == l_Undef )
                return -1;
            if ( status == l_True )
                continue;
            // remove literal
            Vec_IntDrop( vNums, i );
            i--;
        }
    }
    else
    {
        if ( Bmc_CollapseExpandRound( pSat, pSatOn, vLits, vNums, vTemp, nBTLimit, fCanon, -1 ) == -1 )
            return -1;
        if ( Bmc_CollapseExpandRound( pSat, NULL,   vLits, vNums, vTemp, nBTLimit, fCanon, -1 ) == -1 )
            return -1;
    }
/*
    {
        // put into new array
        int i, iLit;
        Vec_IntClear( vNums );
        Vec_IntForEachEntry( vLits, iLit, i )
            if ( iLit != -1 )
                Vec_IntPush( vNums, i );
        //printf( "%d(%d) ", Vec_IntSize(vNums), Vec_IntSize(vLits) );
    }
*/
    return 0;
}